

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_pcm_rb_seek_read(ma_pcm_rb *pRB,ma_uint32 offsetInFrames)

{
  int iVar1;
  ma_uint32 mVar2;
  int in_ESI;
  long in_RDI;
  undefined4 local_14;
  
  if (in_RDI == 0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x8c);
    mVar2 = ma_get_bytes_per_sample(*(ma_format *)(in_RDI + 0x88));
    local_14 = ma_rb_seek_read((ma_rb *)(in_RDI + 0x48),(ulong)(in_ESI * mVar2 * iVar1));
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_pcm_rb_seek_read(ma_pcm_rb* pRB, ma_uint32 offsetInFrames)
{
    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    return ma_rb_seek_read(&pRB->rb, offsetInFrames * ma_pcm_rb_get_bpf(pRB));
}